

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

void rw::d3d::allocateDXT(Raster *raster,int32 dxt,int32 numLevels,bool32 hasAlpha)

{
  uint32 format;
  int32 numlevels;
  void *pvVar1;
  long lVar2;
  
  lVar2 = (long)nativeRasterOffset;
  format = *(uint32 *)(&DAT_0012f5cc + (long)dxt * 4);
  *(uint32 *)((long)&raster->height + lVar2) = format;
  *(bool *)((long)&raster->stride + lVar2) = hasAlpha != 0;
  *(undefined1 *)((long)&raster->stride + lVar2 + 1) = 1;
  numlevels = 0;
  if ((*(char *)((long)&raster->stride + lVar2 + 2) == '\0') &&
     (numlevels = numLevels, (raster->format & 0x8000) == 0)) {
    numlevels = 1;
  }
  pvVar1 = createTexture(raster->width,raster->height,numlevels,hasAlpha,format);
  *(void **)((long)&raster->platform + lVar2) = pvVar1;
  *(byte *)&raster->flags = (byte)raster->flags & 0x7f;
  return;
}

Assistant:

void
allocateDXT(Raster *raster, int32 dxt, int32 numLevels, bool32 hasAlpha)
{
	static uint32 dxtMap[] = {
		0x31545844,	// DXT1
		0x32545844,	// DXT2
		0x33545844,	// DXT3
		0x34545844,	// DXT4
		0x35545844,	// DXT5
	};
	D3dRaster *ras = GETD3DRASTEREXT(raster);
	ras->format = dxtMap[dxt-1];
	ras->hasAlpha = hasAlpha;
	ras->customFormat = 1;
	if(ras->autogenMipmap)
		numLevels = 0;
	else if(raster->format & Raster::MIPMAP)
		{}
	else
		numLevels = 1;
	ras->texture = createTexture(raster->width, raster->height,
	                             numLevels,
	                             ras->autogenMipmap ? D3DUSAGE_AUTOGENMIPMAP : 0,
	                             ras->format);
	raster->flags &= ~Raster::DONTALLOCATE;
}